

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BindHoleAttributeTest::BindHoleAttributeTest
          (BindHoleAttributeTest *this,TestContext *testCtx,RenderContext *renderCtx,
          AttribType *type,int arraySize)

{
  pointer pcVar1;
  deUint32 dVar2;
  _Alloc_hider name;
  AttribType *pAVar3;
  string local_70;
  string local_50;
  
  pAVar3 = type;
  (anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,(int)type)
  ;
  name._M_p = local_50._M_dataplus._M_p;
  (anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,
             (int)pAVar3);
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name._M_p,local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindHoleAttributeTest_00d56bd0;
  this->m_renderCtx = renderCtx;
  (this->m_type).m_name._M_dataplus._M_p = (pointer)&(this->m_type).m_name.field_2;
  pcVar1 = (type->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_type,pcVar1,pcVar1 + (type->m_name)._M_string_length);
  dVar2 = type->m_glTypeEnum;
  (this->m_type).m_locationSize = type->m_locationSize;
  (this->m_type).m_glTypeEnum = dVar2;
  this->m_arraySize = arraySize;
  return;
}

Assistant:

BindHoleAttributeTest::BindHoleAttributeTest (tcu::TestContext&		testCtx,
											  glu::RenderContext&	renderCtx,
											  const AttribType&		type,
											  int					arraySize)
	: TestCase		(testCtx, generateTestName(type, arraySize).c_str(), generateTestName(type, arraySize).c_str())
	, m_renderCtx	(renderCtx)
	, m_type		(type)
	, m_arraySize	(arraySize)
{
}